

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfm.cpp
# Opt level: O0

void embree::storePFM(Ref<embree::Image> *img,FileName *fileName)

{
  undefined8 uVar1;
  char *pcVar2;
  ostream *poVar3;
  void *pvVar4;
  long *in_RDI;
  Color4 c;
  ssize_t x;
  ssize_t y;
  fstream file;
  undefined1 local_278 [16];
  long local_268;
  long local_260;
  long local_248 [2];
  ostream local_238 [520];
  long *local_30;
  long *local_28;
  long *local_20;
  long *local_18;
  long *local_10;
  long *local_8;
  
  local_30 = in_RDI;
  std::fstream::fstream(local_248);
  uVar1 = *(undefined8 *)(local_248[0] + -0x18);
  std::operator|(_S_failbit,_S_badbit);
  std::ios::exceptions((int)local_248 + (int)uVar1);
  pcVar2 = FileName::c_str((FileName *)0x41caef);
  std::operator|(_S_out,_S_bin);
  std::fstream::open((char *)local_248,(_Ios_Openmode)pcVar2);
  poVar3 = std::operator<<(local_238,"PF");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  local_8 = local_30;
  poVar3 = (ostream *)std::ostream::operator<<(local_238,*(ulong *)(*local_30 + 0x10));
  poVar3 = std::operator<<(poVar3," ");
  local_10 = local_30;
  pvVar4 = (void *)std::ostream::operator<<(poVar3,*(ulong *)(*local_30 + 0x18));
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  pvVar4 = (void *)std::ostream::operator<<(local_238,-1.0);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  local_18 = local_30;
  local_260 = *(long *)(*local_30 + 0x18);
  while (local_260 = local_260 + -1, -1 < local_260) {
    for (local_268 = 0; local_20 = local_30, local_268 < *(long *)(*local_30 + 0x10);
        local_268 = local_268 + 1) {
      local_28 = local_30;
      (**(code **)(*(long *)*local_30 + 0x20))(local_278,(long *)*local_30,local_268,local_260);
      std::ostream::write((char *)local_238,(long)local_278);
    }
  }
  std::fstream::~fstream(local_248);
  return;
}

Assistant:

void storePFM(const Ref<Image>& img, const FileName& fileName)
  {
    /* open file for writing */
    std::fstream file;
    file.exceptions (std::fstream::failbit | std::fstream::badbit);
    file.open (fileName.c_str(), std::fstream::out | std::fstream::binary);

    /* write file header */
    file << "PF" << std::endl;
    file << img->width << " " << img->height << std::endl;
    file << -1.0f << std::endl;

    /* write image */
    for (ssize_t y=img->height-1; y>=0; y--) {
      for (ssize_t x=0; x<(ssize_t)img->width; x++) {
        const Color4 c = img->get(x,y);
        file.write((char*)&c,3*sizeof(float));
      }
    }
  }